

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O3

void __thiscall
VectorSUnitTest_erase_range_of_elements_Test::TestBody
          (VectorSUnitTest_erase_range_of_elements_Test *this)

{
  char *pcVar1;
  iterator it3;
  iterator it2;
  iterator it1;
  vector_s<unsigned_int,_12UL> v;
  AssertHelper local_b0;
  AssertHelper local_a8;
  AssertHelper local_a0;
  undefined8 local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  AssertHelper local_68;
  initializer_list<unsigned_int> local_60;
  vector_s<unsigned_int,_12UL> local_50;
  
  local_60._M_array = (iterator)&local_98;
  local_78 = 0x900000008;
  uStack_70 = 0xb0000000a;
  local_88 = 0x500000004;
  uStack_80 = 0x700000006;
  local_98 = 0x100000000;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_300000002;
  local_60._M_len = 0xc;
  estl::vector_s<unsigned_int,_12UL>::vector_s(&local_50,&local_60);
  local_a8.data_._0_4_ = 0xc;
  local_60._M_array = (iterator)local_50.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_98,"12u","v.size()",(uint *)&local_a8,(unsigned_long *)&local_60);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x31e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((AssertHelperData *)local_60._M_array != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_60._M_array + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_60._M_array =
       estl::vector_s<unsigned_int,_12UL>::erase
                 (&local_50,local_50.data_ptr_,
                  (const_iterator)((long)((long)local_50.data_ptr_ + 8) + 4));
  local_a8.data_ = (AssertHelperData *)local_50.data_ptr_;
  testing::internal::CmpHelperEQ<unsigned_int*,unsigned_int*>
            ((internal *)&local_98,"v.begin()","it1",(uint **)&local_a8,&local_60._M_array);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x322,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"3u","*it1",(uint *)&local_a8,local_60._M_array);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x323,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_b0.data_._0_4_ = 9;
  local_a8.data_ = (AssertHelperData *)local_50.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_98,"9u","v.size()",(uint *)&local_b0,(unsigned_long *)&local_a8);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x324,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"3u","v[0]",(uint *)&local_a8,local_50.data_ptr_);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x325,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a8.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"4u","v[1]",(uint *)&local_a8,
             (uint *)((long)local_50.data_ptr_ + 4));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x326,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a8.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"5u","v[2]",(uint *)&local_a8,
             (uint *)((long)local_50.data_ptr_ + 8));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x327,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a8.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"6u","v[3]",(uint *)&local_a8,
             (uint *)((long)((long)local_50.data_ptr_ + 8) + 4));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x328,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a8.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"7u","v[4]",(uint *)&local_a8,
             (uint *)((long)local_50.data_ptr_ + 0x10));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x329,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a8.data_._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"8u","v[5]",(uint *)&local_a8,
             (uint *)((long)local_50.data_ptr_ + 0x14));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x32a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a8.data_._0_4_ = 9;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"9u","v[6]",(uint *)&local_a8,
             (uint *)((long)local_50.data_ptr_ + 0x18));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x32b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a8.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"10u","v[7]",(uint *)&local_a8,
             (uint *)((long)&(((string *)((long)local_50.data_ptr_ + 0x18))->_M_dataplus)._M_p + 4))
  ;
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x32c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a8.data_._0_4_ = 0xb;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"11u","v[8]",(uint *)&local_a8,
             (uint *)&((string *)((long)local_50.data_ptr_ + 0x18))->_M_string_length);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x32d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a8.data_ =
       (AssertHelperData *)
       estl::vector_s<unsigned_int,_12UL>::erase
                 (&local_50,(const_iterator)((long)((long)local_50.data_ptr_ + 8) + 4),
                  (const_iterator)((long)local_50.data_ptr_ + 0x18));
  local_b0.data_ = (AssertHelperData *)((long)((long)local_50.data_ptr_ + 8) + 4);
  testing::internal::CmpHelperEQ<unsigned_int*,unsigned_int*>
            ((internal *)&local_98,"v.begin()+3","it2",(uint **)&local_b0,(uint **)&local_a8);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x331,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_b0.data_._0_4_ = 9;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"9u","*it2",(uint *)&local_b0,&(local_a8.data_)->type);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x332,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a0.data_._0_4_ = 6;
  local_b0.data_ = (AssertHelperData *)local_50.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_98,"6u","v.size()",(uint *)&local_a0,(unsigned_long *)&local_b0);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x333,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_b0.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"3u","v[0]",(uint *)&local_b0,local_50.data_ptr_);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x334,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_b0.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"4u","v[1]",(uint *)&local_b0,
             (uint *)((long)local_50.data_ptr_ + 4));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x335,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_b0.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"5u","v[2]",(uint *)&local_b0,
             (uint *)((long)local_50.data_ptr_ + 8));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x336,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_b0.data_._0_4_ = 9;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"9u","v[3]",(uint *)&local_b0,
             (uint *)((long)((long)local_50.data_ptr_ + 8) + 4));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x337,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_b0.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"10u","v[4]",(uint *)&local_b0,
             (uint *)((long)local_50.data_ptr_ + 0x10));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x338,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_b0.data_._0_4_ = 0xb;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"11u","v[5]",(uint *)&local_b0,
             (uint *)((long)local_50.data_ptr_ + 0x14));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x339,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_b0.data_ =
       (AssertHelperData *)
       estl::vector_s<unsigned_int,_12UL>::erase
                 (&local_50,(const_iterator)((long)local_50.data_ptr_ + local_50.size_ * 4 + -0xc),
                  local_50.data_ptr_ + local_50.size_);
  local_a0.data_ = (AssertHelperData *)(local_50.data_ptr_ + local_50.size_);
  testing::internal::CmpHelperEQ<unsigned_int*,unsigned_int*>
            ((internal *)&local_98,"v.end()","it3",(uint **)&local_a0,(uint **)&local_b0);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x33d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_68.data_._0_4_ = 3;
  local_a0.data_ = (AssertHelperData *)local_50.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_98,"3u","v.size()",(uint *)&local_68,(unsigned_long *)&local_a0);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x33e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a0.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"3u","v[0]",(uint *)&local_a0,local_50.data_ptr_);
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x33f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a0.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"4u","v[1]",(uint *)&local_a0,
             (uint *)((long)local_50.data_ptr_ + 4));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x340,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  local_a0.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_98,"5u","v[2]",(uint *)&local_a0,
             (uint *)((long)local_50.data_ptr_ + 8));
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x341,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  return;
}

Assistant:

TEST_F(VectorSUnitTest, erase_range_of_elements)
{
    vector_s<unsigned, 12> v{0u, 1u, 2u, 3u, 4u, 5u, 6u, 7u, 8u, 9u, 10u, 11u};
    EXPECT_EQ(12u, v.size());

    // Erase 3 elements from the beginning
    const auto it1 = v.erase(v.begin(), v.begin() +3);
    EXPECT_EQ(v.begin(), it1);
    EXPECT_EQ(3u, *it1);
    EXPECT_EQ(9u, v.size());
    EXPECT_EQ(3u, v[0]);
    EXPECT_EQ(4u, v[1]);
    EXPECT_EQ(5u, v[2]);
    EXPECT_EQ(6u, v[3]);
    EXPECT_EQ(7u, v[4]);
    EXPECT_EQ(8u, v[5]);
    EXPECT_EQ(9u, v[6]);
    EXPECT_EQ(10u, v[7]);
    EXPECT_EQ(11u, v[8]);

    // Erase 3 elements from the middle
    const auto it2 = v.erase(v.begin()+3, v.begin()+6);
    EXPECT_EQ(v.begin()+3, it2);
    EXPECT_EQ(9u, *it2);
    EXPECT_EQ(6u, v.size());
    EXPECT_EQ(3u, v[0]);
    EXPECT_EQ(4u, v[1]);
    EXPECT_EQ(5u, v[2]);
    EXPECT_EQ(9u, v[3]);
    EXPECT_EQ(10u, v[4]);
    EXPECT_EQ(11u, v[5]);

    // Erase 3 last element
    const auto it3 = v.erase(v.end()-3, v.end());
    EXPECT_EQ(v.end(), it3);
    EXPECT_EQ(3u, v.size());
    EXPECT_EQ(3u, v[0]);
    EXPECT_EQ(4u, v[1]);
    EXPECT_EQ(5u, v[2]);
}